

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this4.cpp
# Opt level: O0

void __thiscall A::~A(A *this)

{
  ostream *this_00;
  A *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"A::~A()");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::enable_shared_from_this<A>::~enable_shared_from_this(&this->super_enable_shared_from_this<A>)
  ;
  return;
}

Assistant:

~A() {
		cout << "A::~A()" << endl;
	}